

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat operator+(Mat *left,Mat *right)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  ostream *poVar5;
  uint uVar6;
  double *in_RDX;
  ulong uVar7;
  Mat MVar8;
  
  iVar1 = right->n_rows_;
  if ((iVar1 == *(int *)in_RDX) && (iVar2 = right->n_cols_, iVar2 == *(int *)((long)in_RDX + 4))) {
    left->n_rows_ = iVar1;
    left->n_cols_ = iVar2;
    uVar6 = iVar2 * iVar1;
    if ((int)uVar6 < 1) {
      left->v_ = (double *)0x0;
    }
    else {
      pdVar4 = (double *)operator_new__((ulong)uVar6 * 8);
      left->v_ = pdVar4;
      pdVar3 = right->v_;
      in_RDX = (double *)in_RDX[1];
      uVar7 = 0;
      do {
        pdVar4[uVar7] = pdVar3[uVar7] + in_RDX[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    MVar8.v_ = in_RDX;
    MVar8._0_8_ = left;
    return MVar8;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: Incompatible shape in +(Matrix,Matrix)");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

Mat operator + (const Mat& left, const Mat& right)
{
	if ( (left.n_rows_!=right.n_rows_) || (left.n_cols_!=right.n_cols_) ) {
		cerr << "ERROR: Incompatible shape in +(Matrix,Matrix)" << endl;
		exit(1);
	};
	Mat Aux(left.n_rows_,left.n_cols_);
	for (int i=0; i<left.n_rows_*left.n_cols_; i++) 	
		Aux.v_[i] = left.v_[i] + right.v_[i];
	return Aux;
}